

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O1

void __thiscall
Zuker::lambda_swipe_3(Zuker *this,double threshold,double threshold2,ostream *fout,string *outfile)

{
  pointer pdVar1;
  pointer pcVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  long lVar8;
  ostream *poVar9;
  pointer pbVar10;
  double right_lambda;
  double left_lambda;
  double left_O;
  string left_rna;
  double right_mfe;
  double right_cai;
  double left_mfe;
  double left_cai;
  double right_CAI;
  double left_CAI;
  vector<double,_std::allocator<double>_> C_buffer;
  vector<double,_std::allocator<double>_> MFE_buffer;
  vector<double,_std::allocator<double>_> stand_CAI;
  vector<double,_std::allocator<double>_> CAI_buffer;
  vector<double,_std::allocator<double>_> F_buffer;
  vector<double,_std::allocator<double>_> lambda_buffer;
  vector<double,_std::allocator<double>_> O_buffer;
  queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  lambda;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  dataset;
  string right_rna;
  string right_bp;
  string left_bp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  cai_map;
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  mfe_map;
  double local_318;
  double local_310;
  pair<double,_double> local_308;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  mapped_type local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  vector<int,_std::allocator<int>_> *local_290;
  vector<double,_std::allocator<double>_> local_288;
  vector<double,_std::allocator<double>_> local_268;
  vector<double,_std::allocator<double>_> local_248;
  vector<double,_std::allocator<double>_> local_228;
  vector<double,_std::allocator<double>_> local_208;
  vector<double,_std::allocator<double>_> local_1e8;
  vector<double,_std::allocator<double>_> local_1c8;
  _Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_1a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_150;
  string local_138;
  char *local_118;
  long local_110;
  char local_108 [16];
  char *local_f8;
  long local_f0;
  char local_e8 [16];
  string *local_d8;
  double local_d0;
  double local_c8;
  string local_c0;
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_d8 = outfile;
  local_d0 = threshold2;
  local_c8 = threshold;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(&local_150,7,(allocator_type *)&local_1a8);
  local_1a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_initialize_map(&local_1a8,0);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_298 = 0.0;
  local_2a8 = 0.0;
  local_2b0 = 0.0;
  local_2a0 = 10000000.0;
  local_2b8 = 10000000.0;
  local_2c0 = 10000000.0;
  local_2f8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x3ee4f8b588e368f1;
  local_2f8._8_8_ = (pointer)0x3fefffeb074a771d;
  if (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_1a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    _M_push_back_aux<std::pair<double,double>>
              ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_1a8,(pair<double,_double> *)local_2f8);
  }
  else {
    (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = 1e-05;
    (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = 0.99999;
    local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_290 = &this->protein;
    do {
      local_310 = (local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
      local_318 = (local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
      if (local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_1a8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_1a8._M_impl.super__Deque_impl_data._M_start._M_first);
        local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_1a8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_1a8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x20;
        local_1a8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_1a8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_1a8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_2f8._0_8_ = &local_2e8;
      std::__cxx11::string::_M_construct((ulong)local_2f8,(char)this->n * '\x03');
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct((ulong)&local_f8,(char)this->n * '\x03');
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_138,(char)this->n * '\x03');
      local_118 = local_108;
      std::__cxx11::string::_M_construct((ulong)&local_118,(char)this->n * '\x03');
      cVar6 = std::
              _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&local_68,&local_310);
      if (cVar6.super__Node_iterator_base<std::pair<const_double,_double>,_false>._M_cur ==
          (__node_type *)0x0) {
        reinit(this);
        std::__ostream_insert<char,std::char_traits<char>>(fout,"lambda: ",8);
        poVar9 = std::ostream::_M_insert<double>(local_310);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        local_308.first = calculate_CAI_O(this,fout,local_310);
        traceback_B2(this,local_310);
        get_rna_cai(this,(string *)local_2f8);
        pbVar10 = (this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < pbVar10->i) {
          lVar8 = 0;
          do {
            local_f8[pbVar10[lVar8 + 1].i] = '(';
            local_f8[(this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8 + 1].j] = ')';
            pbVar10 = (this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar8 = lVar8 + 1;
          } while (lVar8 < pbVar10->i);
        }
        local_298 = evaluate_CAI((string *)local_2f8,local_290,1);
        local_2a8 = evaluate_CAI((string *)local_2f8,local_290,0);
        local_2d0 = evaluate_MFE((string *)local_2f8);
        local_2b0 = local_2d0;
        pmVar7 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_310);
        *pmVar7 = local_2d0;
        local_2d0 = local_2a8;
        pmVar7 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a0,&local_310);
        *pmVar7 = local_2d0;
        if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_308.first);
        }
        else {
          *local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_308.first;
          local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1e8,
                     (iterator)
                     local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_310);
        }
        else {
          *local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_310;
          local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_208,
                     (iterator)
                     local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2b0);
        }
        else {
          *local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2b0;
          local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_228,
                     (iterator)
                     local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_298);
        }
        else {
          *local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_298;
          local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_248,
                     (iterator)
                     local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2a8);
        }
        else {
          *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2a8;
          local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar8 = (long)this->n;
        iVar5 = (this->start_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8 + -1] + this->minY +
                (this->index_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8 + -1] * 2 +
                n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8 + -1]] * this->minX;
        local_2c8 = (this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar5] / local_310;
        if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_268,
                     (iterator)
                     local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2c8);
        }
        else {
          *local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2c8;
          local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_2c8 = (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar5] / (local_310 + -1.0);
        if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_288,
                     (iterator)
                     local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2c8);
        }
        else {
          *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2c8;
          local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(fout,"rna: ",5);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(char *)local_2f8._0_8_,local_2f8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(fout,"bp: ",4);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_f8,local_f0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
        poVar9 = std::ostream::_M_insert<double>(local_310);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",O: ",4);
        poVar9 = std::ostream::_M_insert<double>(local_308.first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",cai: ",6);
        poVar9 = std::ostream::_M_insert<double>
                           ((this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar5] / (local_310 + -1.0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",mfe: ",6);
        poVar9 = std::ostream::_M_insert<double>
                           ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar5] / local_310);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",integrated: ",0xd);
        poVar9 = std::ostream::_M_insert<double>
                           ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar5] +
                            (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar5]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
        poVar9 = std::ostream::_M_insert<double>(local_310);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",O: ",4);
        poVar9 = std::ostream::_M_insert<double>(local_308.first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",cai: ",6);
        poVar9 = std::ostream::_M_insert<double>(local_298);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",sCAI: ",7);
        poVar9 = std::ostream::_M_insert<double>(local_2a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",mfe: ",6);
        poVar9 = std::ostream::_M_insert<double>(local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",combined: ",0xb);
        poVar9 = std::ostream::_M_insert<double>
                           (local_310 * local_2b0 + (local_310 + -1.0) * local_298);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      else {
        pmVar7 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a0,&local_310);
        local_2a8 = *pmVar7;
        pmVar7 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_310);
        local_2b0 = *pmVar7;
      }
      cVar6 = std::
              _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&local_68,&local_318);
      if (cVar6.super__Node_iterator_base<std::pair<const_double,_double>,_false>._M_cur ==
          (__node_type *)0x0) {
        reinit(this);
        std::__ostream_insert<char,std::char_traits<char>>(fout,"lambda: ",8);
        poVar9 = std::ostream::_M_insert<double>(local_318);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        local_308.first = calculate_CAI_O(this,fout,local_318);
        traceback_B2(this,local_318);
        get_rna_cai(this,&local_138);
        pbVar10 = (this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < pbVar10->i) {
          lVar8 = 0;
          do {
            local_118[pbVar10[lVar8 + 1].i] = '(';
            local_118[(this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8 + 1].j] = ')';
            pbVar10 = (this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar8 = lVar8 + 1;
          } while (lVar8 < pbVar10->i);
        }
        local_2a0 = evaluate_CAI(&local_138,local_290,1);
        local_2b8 = evaluate_CAI(&local_138,local_290,0);
        local_2d0 = evaluate_MFE(&local_138);
        local_2c0 = local_2d0;
        pmVar7 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_318);
        *pmVar7 = local_2d0;
        local_2d0 = local_2b8;
        pmVar7 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a0,&local_318);
        *pmVar7 = local_2d0;
        if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_308.first);
        }
        else {
          *local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_308.first;
          local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1e8,
                     (iterator)
                     local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_318);
        }
        else {
          *local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_318;
          local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_208,
                     (iterator)
                     local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2c0);
        }
        else {
          *local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2c0;
          local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_228,
                     (iterator)
                     local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2a0);
        }
        else {
          *local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2a0;
          local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_248,
                     (iterator)
                     local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2b8);
        }
        else {
          *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2b8;
          local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar8 = (long)this->n;
        iVar5 = (this->start_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8 + -1] + this->minY +
                (this->index_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8 + -1] * 2 +
                n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8 + -1]] * this->minX;
        local_2c8 = (this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar5] / local_318;
        if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_268,
                     (iterator)
                     local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2c8);
        }
        else {
          *local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2c8;
          local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_2c8 = (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar5] / (local_318 + -1.0);
        if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_288,
                     (iterator)
                     local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2c8);
        }
        else {
          *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2c8;
          local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(fout,"rna: ",5);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(fout,"bp: ",4);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_118,local_110);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
        poVar9 = std::ostream::_M_insert<double>(local_318);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",O: ",4);
        poVar9 = std::ostream::_M_insert<double>(local_308.first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",cai: ",6);
        poVar9 = std::ostream::_M_insert<double>
                           ((this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar5] / (local_318 + -1.0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",mfe: ",6);
        poVar9 = std::ostream::_M_insert<double>
                           ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar5] / local_318);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",integrated: ",0xd);
        poVar9 = std::ostream::_M_insert<double>
                           ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar5] +
                            (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar5]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
        poVar9 = std::ostream::_M_insert<double>(local_318);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",O: ",4);
        poVar9 = std::ostream::_M_insert<double>(local_308.first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",cai: ",6);
        poVar9 = std::ostream::_M_insert<double>(local_2a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",sCAI: ",7);
        poVar9 = std::ostream::_M_insert<double>(local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",mfe: ",6);
        poVar9 = std::ostream::_M_insert<double>(local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",combined: ",0xb);
        poVar9 = std::ostream::_M_insert<double>
                           (local_318 * local_2c0 + (local_318 + -1.0) * local_2a0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      else {
        pmVar7 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a0,&local_318);
        local_2b8 = *pmVar7;
        pmVar7 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_318);
        local_2c0 = *pmVar7;
      }
      bVar4 = compare(local_2a8,local_2b8,1e-05);
      if (!bVar4) {
        bVar4 = compare(local_2b0,local_2c0,1e-05);
        if (!bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"lamda diff: ",0xc);
          poVar9 = std::ostream::_M_insert<double>(local_318 - local_310);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if (local_c8 <= local_318) {
            bVar4 = compare(local_310,local_318,local_c8);
            if (!bVar4) {
              local_308.first = local_310;
              local_308.second = local_310 * 0.4 + local_318 * 0.6;
              local_2d0 = local_308.second;
              if (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                _M_push_back_aux<std::pair<double,double>>
                          ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                            *)&local_1a8,&local_308);
              }
              else {
                (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_310;
                (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
                     local_308.second;
                local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              local_308.first = local_2d0;
              local_308.second = local_318;
              if (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                  local_1a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1)
              goto LAB_0013b1d4;
              std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_push_back_aux<std::pair<double,double>>
                        ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *
                         )&local_1a8,&local_308);
            }
          }
          else {
            bVar4 = compare(local_310,local_318,local_d0);
            if (!bVar4) {
              local_308.first = local_310;
              local_308.second = local_310 * 0.4 + local_318 * 0.6;
              local_2d0 = local_308.second;
              if (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                _M_push_back_aux<std::pair<double,double>>
                          ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                            *)&local_1a8,&local_308);
              }
              else {
                (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_310;
                (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
                     local_308.second;
                local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              local_308.first = local_2d0;
              local_308.second = local_318;
              if (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                _M_push_back_aux<std::pair<double,double>>
                          ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                            *)&local_1a8,&local_308);
              }
              else {
LAB_0013b1d4:
                (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_2d0;
                (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = local_318;
                local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                local_308.first = local_2d0;
                local_308.second = local_318;
              }
            }
          }
        }
      }
      if (local_118 != local_108) {
        operator_delete(local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &local_2e8) {
        operator_delete((void *)local_2f8._0_8_);
      }
    } while (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1a8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size : ",7);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"left lambda: ",0xd);
  poVar9 = std::ostream::_M_insert<double>(local_310);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",right lambda: ",0xf);
  poVar9 = std::ostream::_M_insert<double>(local_318);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  local_2f8._0_8_ = "lambda";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2f8 + 8),&local_1e8);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             local_150.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2f8);
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2f8._8_8_);
  }
  local_2f8._0_8_ = "rc_mfe";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2f8 + 8),&local_208);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2f8);
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2f8._8_8_);
  }
  local_2f8._0_8_ = "rc_CAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2f8 + 8),&local_228);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2f8);
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2f8._8_8_);
  }
  local_2f8._0_8_ = "rc_sCAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2f8 + 8),&local_248);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2f8);
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2f8._8_8_);
  }
  local_2f8[0] = 0x4f;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2f8 + 8),&local_1c8);
  ppVar3 = local_150.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace_aux
            ((ulong)(local_150.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4),0,
             local_150.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].first._M_string_length,'\x01');
  pdVar1 = ppVar3[4].second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar3[4].second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2f8._8_8_;
  ppVar3[4].second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2e8._M_allocated_capacity;
  ppVar3[4].second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_2e8._8_8_;
  local_2f8._8_8_ = (pointer)0x0;
  local_2e8._M_allocated_capacity = 0;
  local_2e8._8_8_ = 0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2f8._8_8_);
  }
  local_2f8._0_8_ = "mfe";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2f8 + 8),&local_268);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2f8);
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2f8._8_8_);
  }
  local_2f8._0_8_ = "CAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2f8 + 8),&local_288);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 6),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2f8);
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2f8._8_8_);
  }
  pcVar2 = (local_d8->_M_dataplus)._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + local_d8->_M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  write_csv(&local_c0,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"swipe done",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base(&local_1a8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~vector(&local_150);
  if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Zuker::lambda_swipe_3(double threshold, double threshold2, ostream &fout, string & outfile) {
    double left_lambda;
    double right_lambda;
    vector<double> O_buffer,lambda_buffer,F_buffer,CAI_buffer,stand_CAI;
    vector<double> MFE_buffer, C_buffer;
    vector<pair<string, vector<double>>> dataset(7);
    queue<pair<double, double>> lambda;
    unordered_map<double, double> mfe_map;
    unordered_map<double, double> cai_map;
    double left_CAI = 0, left_cai = 0, left_mfe = 0, right_CAI = inf, right_cai = inf, right_mfe = inf;

    lambda.push({EPSILON,1-EPSILON});
    int idx;

    while (!lambda.empty()) {
        left_lambda=  lambda.front().first, right_lambda = lambda.front().second;
        lambda.pop();
        string left_rna(3*n, '.'), left_bp(3*n, '.'), right_rna(3*n, '.'), right_bp(3*n, '.');
        if (mfe_map.count(left_lambda) != 0) {
            left_cai = cai_map[left_lambda];
            left_mfe = mfe_map[left_lambda];
        } else {
            reinit();
            fout << "lambda: " << left_lambda << endl;
            double left_O = calculate_CAI_O(fout,left_lambda);
            traceback_B2(left_lambda);
            get_rna_cai(left_rna);
            get_bp(left_bp);
            left_CAI = evaluate_CAI(left_rna, protein, 1);
            left_cai = evaluate_CAI(left_rna, protein, 0);
            left_mfe = evaluate_MFE(left_rna);
            mfe_map[left_lambda] = left_mfe;
            cai_map[left_lambda] = left_cai;
            O_buffer.push_back(left_O);
            lambda_buffer.push_back(left_lambda);
            F_buffer.push_back(left_mfe);
            CAI_buffer.push_back(left_CAI);
            stand_CAI.push_back(left_cai);
            idx = index(0, n-1, 0, 2, minX, minY);
            MFE_buffer.push_back(Z2[idx] / left_lambda);
            C_buffer.push_back(Z_CAI[idx] / (left_lambda-1));
            fout << "rna: " << left_rna << endl;
            fout << "bp: " << left_bp << endl;
            cout << "lambda: " << left_lambda << ",O: " << left_O << ",cai: " << Z_CAI[idx] / (left_lambda-1) << ",mfe: " << Z2[idx] / left_lambda << ",integrated: " << Z2[idx] + Z_CAI[idx] << endl;
            cout << "lambda: " << left_lambda << ",O: " << left_O << ",cai: " << left_CAI << ",sCAI: " << left_cai << ",mfe: " << left_mfe << ",combined: " << left_lambda*left_mfe+(left_lambda-1)*left_CAI << endl;

        }

        if (mfe_map.count(right_lambda) != 0) {
            right_cai = cai_map[right_lambda];
            right_mfe = mfe_map[right_lambda];
        } else {
            reinit();
            fout << "lambda: " << right_lambda << endl;
            double right_O = calculate_CAI_O(fout,right_lambda);
            traceback_B2(right_lambda);
            get_rna_cai(right_rna);
            get_bp(right_bp);
            right_CAI = evaluate_CAI(right_rna, protein, 1);
            right_cai = evaluate_CAI(right_rna, protein, 0);
            right_mfe = evaluate_MFE(right_rna);
            mfe_map[right_lambda] = right_mfe;
            cai_map[right_lambda] = right_cai;
            O_buffer.push_back(right_O);
            lambda_buffer.push_back(right_lambda);
            F_buffer.push_back(right_mfe);
            CAI_buffer.push_back(right_CAI);
            stand_CAI.push_back(right_cai);
            idx = index(0, n-1, 0, 2, minX, minY);
            MFE_buffer.push_back(Z2[idx] / right_lambda);
            C_buffer.push_back(Z_CAI[idx] / (right_lambda-1));
            fout << "rna: " << right_rna << endl;
            fout << "bp: " << right_bp << endl;
            cout << "lambda: " << right_lambda << ",O: " << right_O << ",cai: " << Z_CAI[idx] / (right_lambda-1) << ",mfe: " << Z2[idx] / right_lambda << ",integrated: " << Z2[idx] + Z_CAI[idx] << endl;
            cout << "lambda: " << right_lambda << ",O: " << right_O << ",cai: " << right_CAI << ",sCAI: " << right_cai << ",mfe: " << right_mfe << ",combined: " << right_lambda*right_mfe+(right_lambda-1)*right_CAI << endl;

        }
        if (!compare(left_cai, right_cai) && !compare(left_mfe, right_mfe)) {
            cout << "lamda diff: " << right_lambda-left_lambda << endl;
            if (right_lambda < threshold) {
                if (!compare(left_lambda,right_lambda,threshold2)) {
                    double m = left_lambda * 0.4 + right_lambda * 0.6;
                    lambda.push({left_lambda, m});
                    lambda.push({m, right_lambda});
                }
            } else {
                if (!compare(left_lambda,right_lambda,threshold)) {
                    double m = left_lambda * 0.4 + right_lambda * 0.6;
                    lambda.push({left_lambda, m});
                    lambda.push({m, right_lambda});
                }
            }

        }
    }
    cout << "size : " << lambda.size() << endl;
    fout << "left lambda: " << left_lambda << ",right lambda: " << right_lambda << endl;
    dataset[0] = make_pair("lambda", lambda_buffer);
    dataset[1] = make_pair("rc_mfe", F_buffer);
    dataset[2] = make_pair("rc_CAI", CAI_buffer);
    dataset[3] = make_pair("rc_sCAI", stand_CAI);
    dataset[4] = make_pair('O', O_buffer);
    dataset[5] = make_pair("mfe", MFE_buffer);
    dataset[6] = make_pair("CAI", C_buffer);
    write_csv(outfile + ".csv", dataset);
    cout << "swipe done" << endl;
}